

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O0

void __thiscall btSymmetricSpatialDyad::btSymmetricSpatialDyad(btSymmetricSpatialDyad *this)

{
  btSymmetricSpatialDyad *in_RDI;
  btMatrix3x3 *unaff_retaddr;
  
  btMatrix3x3::btMatrix3x3(unaff_retaddr);
  btMatrix3x3::btMatrix3x3(unaff_retaddr);
  btMatrix3x3::btMatrix3x3(unaff_retaddr);
  setIdentity(in_RDI);
  return;
}

Assistant:

btSymmetricSpatialDyad() { setIdentity(); }